

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decide.cpp
# Opt level: O1

double Place_Turn(int dep,GameBoard *gameBoard,int pl_col,int this_bl_type,int *finalX,int *finalY,
                 int *finalO,int *blockFE)

{
  double *pdVar1;
  undefined8 *puVar2;
  _Base_ptr p_Var3;
  double dVar4;
  pointer pdVar5;
  Tetris te;
  pointer pTVar6;
  uint uVar7;
  _Self __tmp_1;
  ulong uVar8;
  _Base_ptr p_Var9;
  time_t tVar10;
  undefined8 extraout_RAX;
  Board *pBVar11;
  int iVar12;
  long lVar13;
  undefined1 auVar14 [8];
  ulong uVar15;
  undefined1 *puVar16;
  undefined4 in_register_0000003c;
  double *pdVar17;
  pointer pvVar18;
  Block *this;
  Board *pBVar19;
  undefined1 *puVar20;
  long lVar21;
  double dVar22;
  undefined8 uVar23;
  pointer piVar26;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  _Self __tmp;
  int this_ht;
  int ch2;
  vector<Tetris,_std::allocator<Tetris>_> loc;
  int ch1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  A;
  set<Plan,_std::less<Plan>,_std::allocator<Plan>_> s;
  double p1 [45];
  double p2 [45];
  GameBoard nowBoard;
  Standard_Simplex ss;
  Slash_Simplex as;
  uint uStack_1cfa8;
  pointer piStack_1cfa0;
  double dStack_1cf98;
  int iStack_1cf90;
  bool abStack_1cf8c [4];
  vector<Tetris,_std::allocator<Tetris>_> vStack_1cf88;
  undefined8 uStack_1cf70;
  int iStack_1cf68;
  int iStack_1cf64;
  undefined8 uStack_1cf60;
  pointer piStack_1cf58;
  pointer piStack_1cf50;
  Board *pBStack_1cf48;
  pointer piStack_1cf40;
  int *piStack_1cf38;
  int *piStack_1cf30;
  int *piStack_1cf28;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  vStack_1cf20;
  _Rb_tree<Plan,_Plan,_std::_Identity<Plan>,_std::less<Plan>,_std::allocator<Plan>_> _Stack_1cf08;
  Board aBStack_1ced8 [2];
  Block aBStack_1cd68 [22];
  GameBoard GStack_1cbfc;
  Standard_Simplex SStack_1c1d8;
  undefined1 auStack_15fd8 [8];
  pointer piStack_15fd0;
  pointer piStack_15fc8;
  undefined8 auStack_15fc0 [104];
  ulong auStack_15c80 [11131];
  char acStack_a8 [112];
  double local_38;
  
  uStack_1cf70 = CONCAT44(in_register_0000003c,dep);
  if (dep == 5) {
    dVar22 = naive_place(gameBoard,pl_col,this_bl_type);
    return dVar22;
  }
  vStack_1cf88.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vStack_1cf88.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vStack_1cf88.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  GameBoard::getPlaces(gameBoard,pl_col,this_bl_type,&vStack_1cf88,true);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&vStack_1cf20,
           ((long)vStack_1cf88.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)vStack_1cf88.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * -0x3333333333333333,
           (allocator_type *)auStack_15fd8);
  _Stack_1cf08._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_1cf08._M_impl.super__Rb_tree_header._M_header;
  _Stack_1cf08._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_1cf08._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_1cf08._M_impl.super__Rb_tree_header._M_node_count = 0;
  piStack_1cf28 = finalY;
  _Stack_1cf08._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_1cf08._M_impl.super__Rb_tree_header._M_header._M_left;
  GameBoard::GameBoard(&GStack_1cbfc);
  if (vStack_1cf88.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      vStack_1cf88.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
      super__Vector_impl_data._M_start) {
    dStack_1cf98 = -100000.0;
    piStack_1cfa0 = (pointer)0x0;
  }
  else {
    piStack_1cf38 = finalO;
    iStack_1cf64 = this_bl_type;
    piStack_1cf30 = finalX;
    if (vStack_1cf88.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        vStack_1cf88.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar13 = 0;
      this = aBStack_1cd68;
      pBVar19 = (Board *)auStack_15fd8;
      uVar15 = 0;
      do {
        puVar20 = (undefined1 *)(ulong)(uint)pl_col;
        global_i = (int)uVar15;
        Board::Board((Board *)&SStack_1c1d8,pl_col,gameBoard);
        Board::Board(aBStack_1ced8,pl_col,gameBoard);
        puVar2 = (undefined8 *)
                 ((long)&(vStack_1cf88.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                          super__Vector_impl_data._M_start)->blockY + lVar13);
        te._16_8_ = *puVar2;
        te._0_16_ = *(undefined1 (*) [16])
                     ((long)&(vStack_1cf88.super__Vector_base<Tetris,_std::allocator<Tetris>_>.
                              _M_impl.super__Vector_impl_data._M_start)->gameBoard + lVar13);
        te.shape = (int (*) [8])puVar2[1];
        te._32_8_ = *(undefined8 *)
                     ((long)&(vStack_1cf88.super__Vector_base<Tetris,_std::allocator<Tetris>_>.
                              _M_impl.super__Vector_impl_data._M_start)->color + lVar13);
        Block::Block(this,te);
        memcpy(pBVar19,&SStack_1c1d8,0x88);
        abStack_1cf8c[0] = false;
        if (Eval.super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
          uStack_1cfa8 = pl_col;
          goto LAB_0011ab25;
        }
        piStack_1cfa0 =
             (pointer)(*Eval._M_invoker)((_Any_data *)&Eval,pBVar19,this,(double *)&uStack_1cf60,
                                         abStack_1cf8c);
        eval(aBStack_1ced8,this,(int *)abStack_1cf8c,&iStack_1cf90);
        auStack_15fd8 = (undefined1  [8])piStack_1cfa0;
        if ((int)uStack_1cf70 == 1) {
          if (gameBoard->currBotColor == pl_col) {
            auStack_15fd8 = (undefined1  [8])((double)piStack_1cfa0 + -100.0);
            if (enemyele + iStack_1cf90 < 0x15) {
              auStack_15fd8 = (undefined1  [8])piStack_1cfa0;
            }
            if (0x14 < enemyht + myele) {
              auStack_15fd8 = (undefined1  [8])((double)auStack_15fd8 + 10000.0);
            }
          }
          else if (0x14 < iStack_1cf90 + myele) {
            auStack_15fd8 = (undefined1  [8])((double)piStack_1cfa0 + -100.0);
          }
        }
        piStack_15fd0 = (pointer)CONCAT44(uStack_1cf60._4_4_,(int)uStack_1cf60);
        piStack_15fc8 = (pointer)CONCAT44(piStack_15fc8._4_4_,(int)uVar15);
        std::_Rb_tree<Plan,_Plan,_std::_Identity<Plan>,_std::less<Plan>,_std::allocator<Plan>_>::
        _M_insert_unique<Plan>(&_Stack_1cf08,(Plan *)pBVar19);
        uVar15 = uVar15 + 1;
        uVar8 = ((long)vStack_1cf88.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)vStack_1cf88.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
        lVar13 = lVar13 + 0x28;
      } while (uVar15 <= uVar8 && uVar8 - uVar15 != 0);
    }
    uVar7 = (int)((ulong)((long)vStack_1cf88.super__Vector_base<Tetris,_std::allocator<Tetris>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)vStack_1cf88.super__Vector_base<Tetris,_std::allocator<Tetris>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
    pBVar11 = (Board *)0xa;
    if ((int)uVar7 < 10) {
      pBVar11 = (Board *)(ulong)uVar7;
    }
    if ((int)uVar7 < 1) {
      piStack_1cfa0 = (pointer)0x0;
    }
    else {
      iStack_1cf68 = (int)uStack_1cf70 + 1;
      lVar21 = 0;
      lVar13 = 0;
      p_Var9 = _Stack_1cf08._M_impl.super__Rb_tree_header._M_header._M_left;
      auVar14 = (undefined1  [8])(pointer)0x0;
      pBStack_1cf48 = (Board *)(pointer)0x0;
      piVar26 = (pointer)0x0;
      do {
        pTVar6 = vStack_1cf88.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar12 = *(int *)&p_Var9[1]._M_left;
        piStack_1cf40 = piVar26;
        memcpy(&GStack_1cbfc,gameBoard,0xa24);
        GameBoard::place(&GStack_1cbfc,pl_col,iStack_1cf64,pTVar6[iVar12].blockX,
                         pTVar6[iVar12].blockY,pTVar6[iVar12].orientation);
        GameBoard::eliminate(&GStack_1cbfc,pl_col);
        Jam_Turn((vector<int,_std::allocator<int>_> *)auStack_15fd8,iStack_1cf68,&GStack_1cbfc,
                 pl_col,(vector<double,_std::allocator<double>_> *)
                        ((long)&((vStack_1cf20.
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start + lVar21));
        piStack_1cfa0 = (pointer)auStack_15fd8;
        piStack_1cf58 = piStack_15fd0;
        piStack_1cf50 = piStack_15fc8;
        auStack_15fd8 = (undefined1  [8])0x0;
        piStack_15fd0 = (pointer)0x0;
        piStack_15fc8 = (pointer)0x0;
        if (auVar14 != (undefined1  [8])0x0) {
          operator_delete((void *)auVar14);
        }
        if (auStack_15fd8 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_15fd8);
        }
        lVar13 = lVar13 + 1;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        uVar7 = (int)((ulong)((long)vStack_1cf88.super__Vector_base<Tetris,_std::allocator<Tetris>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)vStack_1cf88.super__Vector_base<Tetris,_std::allocator<Tetris>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
        if (9 < (int)uVar7) {
          uVar7 = 10;
        }
        pBVar11 = (Board *)(ulong)uVar7;
        lVar21 = lVar21 + 0x18;
        auVar14 = (undefined1  [8])piStack_1cfa0;
        pBStack_1cf48 = (Board *)piStack_1cf58;
        piVar26 = piStack_1cf50;
      } while (lVar13 < (int)uVar7);
    }
    piStack_1cf58 =
         (pointer)((long)((vStack_1cf20.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)((vStack_1cf20.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start);
    uStack_1cfa8 = (uint)((ulong)piStack_1cf58 >> 3);
    pBStack_1cf48 = pBVar11;
    if (0 < (int)pBVar11) {
      lVar13 = (long)(int)uStack_1cf70;
      pBVar19 = (Board *)0x0;
      p_Var9 = _Stack_1cf08._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        if (0 < (int)uStack_1cfa8) {
          p_Var3 = p_Var9[1]._M_parent;
          dVar22 = F_ROUND_WIGHT[lVar13];
          pdVar5 = vStack_1cf20.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)pBVar19].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar4 = *(double *)(p_Var9 + 1);
          uVar15 = 0;
          do {
            pdVar5[uVar15] = pdVar5[uVar15] + dVar22 * dVar4 + (double)p_Var3;
            uVar15 = uVar15 + 1;
          } while ((uStack_1cfa8 & 0x7fffffff) != uVar15);
        }
        pBVar19 = (Board *)((long)pBVar19->rows + 1);
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while (pBVar19 != pBVar11);
    }
    memset(SStack_1c1d8.b,0,0x61f8);
    pBVar19 = pBStack_1cf48;
    iVar12 = (int)pBStack_1cf48;
    SStack_1c1d8.n = iVar12 + 2;
    SStack_1c1d8.m = uStack_1cfa8 + 2;
    this = (Block *)(long)iVar12;
    puVar20 = (undefined1 *)((long)&this->x + 1);
    SStack_1c1d8.c[(long)((long)&this->x + 1)] = 1.0;
    SStack_1c1d8.c[(long)((long)&this->x + 2)] = -1.0;
    if (0 < (int)uStack_1cfa8) {
      pdVar17 = SStack_1c1d8.a[1] + 1;
      uVar15 = 1;
      do {
        SStack_1c1d8.b[uVar15] = 0.0;
        if (0 < iVar12) {
          lVar13 = 0;
          pvVar18 = vStack_1cf20.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            pdVar17[lVar13] =
                 -(pvVar18->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar15 - 1];
            lVar13 = lVar13 + 1;
            pvVar18 = pvVar18 + 1;
          } while ((ulong)(iVar12 + 1) - 1 != lVar13);
        }
        pdVar1 = SStack_1c1d8.a[uVar15] + (long)((long)&this->x + 1);
        *pdVar1 = 1.0;
        pdVar1[1] = -1.0;
        uVar15 = uVar15 + 1;
        pdVar17 = pdVar17 + 0x37;
      } while (uVar15 != uStack_1cfa8 + 1);
    }
    lVar13 = (long)piStack_1cf58 * 0x20000000 + 0x100000000;
    *(undefined8 *)((long)SStack_1c1d8.b + (lVar13 >> 0x1d)) = 0x3ff0000000000000;
    if (0 < iVar12) {
      lVar13 = lVar13 >> 0x20;
      puVar16 = (undefined1 *)((long)pBVar11[-1].cols + 0x2f);
      auVar24._8_4_ = (int)puVar16;
      auVar24._0_8_ = puVar16;
      auVar24._12_4_ = (int)((ulong)puVar16 >> 0x20);
      uVar15 = 0;
      auVar24 = auVar24 ^ _DAT_0011e240;
      do {
        auVar27._8_4_ = (int)uVar15;
        auVar27._0_8_ = uVar15;
        auVar27._12_4_ = (int)(uVar15 >> 0x20);
        auVar27 = (auVar27 | _DAT_0011e230) ^ _DAT_0011e240;
        if ((bool)(~(auVar27._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar27._0_4_ ||
                    auVar24._4_4_ < auVar27._4_4_) & 1)) {
          SStack_1c1d8.a[lVar13][uVar15 + 1] = 1.0;
        }
        if ((auVar27._12_4_ != auVar24._12_4_ || auVar27._8_4_ <= auVar24._8_4_) &&
            auVar27._12_4_ <= auVar24._12_4_) {
          SStack_1c1d8.a[lVar13][uVar15 + 2] = 1.0;
        }
        uVar15 = uVar15 + 2;
      } while ((iVar12 + 1U & 0xfffffffe) != uVar15);
    }
    SStack_1c1d8.b[SStack_1c1d8.m] = -1.0;
    if (0 < iVar12) {
      puVar16 = (undefined1 *)((long)pBVar11[-1].cols + 0x2f);
      auVar25._8_4_ = (int)puVar16;
      auVar25._0_8_ = puVar16;
      auVar25._12_4_ = (int)((ulong)puVar16 >> 0x20);
      uVar15 = 0;
      auVar25 = auVar25 ^ _DAT_0011e240;
      do {
        auVar28._8_4_ = (int)uVar15;
        auVar28._0_8_ = uVar15;
        auVar28._12_4_ = (int)(uVar15 >> 0x20);
        auVar24 = (auVar28 | _DAT_0011e230) ^ _DAT_0011e240;
        if ((bool)(~(auVar24._4_4_ == auVar25._4_4_ && auVar25._0_4_ < auVar24._0_4_ ||
                    auVar25._4_4_ < auVar24._4_4_) & 1)) {
          SStack_1c1d8.a[SStack_1c1d8.m][uVar15 + 1] = -1.0;
        }
        if ((auVar24._12_4_ != auVar25._12_4_ || auVar24._8_4_ <= auVar25._8_4_) &&
            auVar24._12_4_ <= auVar25._12_4_) {
          SStack_1c1d8.a[SStack_1c1d8.m][uVar15 + 2] = -1.0;
        }
        uVar15 = uVar15 + 2;
      } while ((iVar12 + 1U & 0xfffffffe) != uVar15);
    }
    Slash_Simplex::Slash_Simplex((Slash_Simplex *)auStack_15fd8,&SStack_1c1d8);
    Slash_Simplex::simplex((Slash_Simplex *)auStack_15fd8,false);
    if ((int)uStack_1cf70 == 1) {
LAB_0011ab25:
      iVar12 = gameBoard->turnID;
      tVar10 = time((time_t *)0x0);
      srand(iVar12 * (int)tVar10);
      if (0 < (int)pBVar19) {
        lVar13 = 0;
        do {
          uVar23 = 0;
          if (acStack_a8[lVar13 + 1] == '\x01') {
            uVar23 = auStack_15fc0[lVar13];
          }
          *(undefined8 *)(aBStack_1ced8[0].rows + lVar13 * 2 + 2) = uVar23;
          lVar13 = lVar13 + 1;
        } while (((ulong)puVar20 & 0xffffffff) - 1 != lVar13);
      }
      if (0 < (int)uStack_1cfa8) {
        lVar13 = 0;
        do {
          iVar12 = (int)this + 3 + (int)lVar13;
          uVar15 = 0;
          if (acStack_a8[iVar12] == '\0') {
            uVar15 = auStack_15c80[iVar12] ^ 0x8000000000000000;
          }
          *(ulong *)(&aBStack_1cd68[0].o + lVar13 * 2) = uVar15;
          lVar13 = lVar13 + 1;
        } while ((ulong)(uStack_1cfa8 + 1) - 1 != lVar13);
      }
      get_CH((double *)aBStack_1ced8,(int)pBVar19,(int *)&uStack_1cf60);
      p_Var9 = _Stack_1cf08._M_impl.super__Rb_tree_header._M_header._M_left;
      if (0 < (int)uStack_1cf60) {
        do {
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
          uStack_1cf60._0_4_ = (int)uStack_1cf60 + -1;
        } while ((int)uStack_1cf60 != 0);
      }
      iVar12 = *(int *)&p_Var9[1]._M_left;
      *piStack_1cf30 =
           vStack_1cf88.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
           super__Vector_impl_data._M_start[iVar12].blockX;
      *piStack_1cf28 =
           vStack_1cf88.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
           super__Vector_impl_data._M_start[iVar12].blockY;
      *piStack_1cf38 =
           vStack_1cf88.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
           super__Vector_impl_data._M_start[iVar12].orientation;
      get_CH((double *)aBStack_1cd68,uStack_1cfa8,(int *)abStack_1cf8c);
      std::_Rb_tree<Plan,_Plan,_std::_Identity<Plan>,_std::less<Plan>,_std::allocator<Plan>_>::
      ~_Rb_tree(&_Stack_1cf08);
      if (piStack_1cfa0 != (pointer)0x0) {
        operator_delete(piStack_1cfa0);
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&vStack_1cf20);
      if (vStack_1cf88.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_1cf88.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      _Unwind_Resume(extraout_RAX);
    }
    dStack_1cf98 = local_38;
  }
  std::_Rb_tree<Plan,_Plan,_std::_Identity<Plan>,_std::less<Plan>,_std::allocator<Plan>_>::~_Rb_tree
            (&_Stack_1cf08);
  if (piStack_1cfa0 != (pointer)0x0) {
    operator_delete(piStack_1cfa0);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&vStack_1cf20);
  if (vStack_1cf88.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_1cf88.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return dStack_1cf98;
}

Assistant:

double Place_Turn(int dep, GameBoard& gameBoard, int pl_col, int this_bl_type, int &finalX = nouse, int &finalY = nouse, int &finalO = nouse, int &blockFE = nouse) //floc 表示最终选的块的位置,blockFE表示给敌人的块
{
    if (dep == (gameBoard.turnID < 10 ? DEPTH_LIM_2 : DEPTH_LIM_1)) //最后一层直接贪
        return naive_place(gameBoard, pl_col, this_bl_type);
    //debug(dep);
    std::vector<Tetris> loc;
    gameBoard.getPlaces(pl_col, this_bl_type, loc);
    int i, j, n, m;
    vector<vector<double> > A(loc.size());
    vector<int> index;
    set<Plan> s;
    GameBoard nowBoard;
    if(loc.size() == 0)
        return -1e5;
    for (i = 0; i < loc.size(); i++)
    {
        global_i = i;
        #ifdef DEBUG_DECIDE
        debug(i);
        debug(loc[i].blockX);
        debug(loc[i].blockY);
        debug(loc[i].orientation);
        #endif
        Board myBoard(pl_col, gameBoard), myBoard2(pl_col, gameBoard);
        Block now_bl = Block(loc[i]);
        double inh;
        double now_val = Eval(myBoard, now_bl, inh,0);
        int this_ele, this_ht;
        eval(myBoard2, now_bl, this_ele, this_ht);
        if(dep == 1)
        {
            if(pl_col == gameBoard.currBotColor) //考虑自己的局面
            {
                if(this_ht + enemyele > 20)
                    now_val -= Risk_Value;
                if(myele + enemyht > 20)
                    now_val += MustWin;
            }
            else
            {
                if(myele + this_ht > 20)
                    now_val -= Risk_Value;
            }
        }
        
        s.insert(Plan(now_val, inh, i));
    }
        //debug(now_val);
    set<Plan>::iterator it=s.begin();
    for (i = 0; i < min((int)loc.size(), MAX_SEARCH); i++, it++)    
    {
        int ind = (*it).idx;
        //debug(ind);
        #ifdef DEBUG_DECIDE
        debug(loc[ind].blockX);
        debug(loc[ind].blockY);
        debug(loc[ind].orientation);
        debug((*it).eva);
        #endif
        nowBoard = gameBoard;
        nowBoard.place(pl_col, this_bl_type, loc[ind].blockX, loc[ind].blockY, loc[ind].orientation);
        nowBoard.eliminate(pl_col);
        index = Jam_Turn(dep + 1, nowBoard, pl_col, A[i]);
    }
    n = min((int)loc.size(), MAX_SEARCH);
    m = A[0].size();

    //debug(n);
    //debug(m);
    for(it = s.begin(), i = 0; i < n; i++, it++)
    {
        double val = (*it).eva;
        double inh = (*it).inh;
        for (j = 0; j < m; j++)
        {
            #ifdef DEBUG_DECIDE
            cerr << A[i][j] << " ";
            #endif
            A[i][j] += val * F_ROUND_WIGHT[dep];
            A[i][j] += inh;
        }
        #ifdef DEBUG_DECIDE
        cerr << endl;
        #endif
    }
    Standard_Simplex ss;
    ss.n = n + 2, ss.m = m + 2;
    ss.c[n+1] = 1;
    ss.c[n+2] = -1;
    for(i = 1; i <= m; i++)
    {
        ss.b[i] = 0;
        for(j = 1; j <= n; j++)
            ss.a[i][j] = -A[j-1][i-1]; //注意下标要-1
        ss.a[i][n+1] = 1;
        ss.a[i][n+2] = -1;
    }   
    ss.b[m+1] = 1;
    for(j = 1; j <= n; j++)
        ss.a[m+1][j] = 1;
    ss.b[m+2] = -1;
    for(j = 1; j <= n; j++)
        ss.a[m+2][j] = -1;

    Slash_Simplex as(ss);
    //as.Print();
    int zt = as.simplex(0);
    //debug("end*******************************************");
    if(dep != 1) //不是第一层就不用考虑决策的事情
        return as.rel;
    //决策过程
    srand(gameBoard.turnID * time(0));
    double p1[45], p2[45], rd, sum;
    int ch1, ch2;
    for (i = 1; i <= n; i++)
    {
        if(as.basic[i])
            p1[i] = as.b[i];
        else p1[i] = 0;
        #ifdef DEBUG_DECIDE
        cerr << p1[i] << " ";
        #endif
    }
    #ifdef DEBUG_DECIDE
    cerr << endl;
    #endif
    for (i = 1; i <= m; i++) //得到对偶的答案
    {
        if(!as.basic[i+n+2])
            p2[i] = -as.c[i+n+2];
        else p2[i] = 0;
        #ifdef DEBUG_DECIDE
        cerr << p2[i] << " ";
        #endif
    }

    //debug("get ans");
    #ifdef DEBUG_DECIDE
    cerr << endl;
    #endif
    
    get_CH(p1,n,ch1);
    //debug(ch1);
    for (it = s.begin(), i = 0; i < ch1; i++, it++);
    int ind = (*it).idx;
    finalX = loc[ind].blockX;
    finalY = loc[ind].blockY;
    finalO = loc[ind].orientation;
    //debug(ch1);
    //debug("get loc");

    get_CH(p2,m,ch2);

    /*sum = 0;
    max_p = 0;
    rd = (double)(rand()%10000) / 10000.0;
    for (i = 1; i <= m; i++)
        if(p2[i] >= max_p)
        {
            ch2 = i - 1;
            max_p = p2[i];
            //break;
        }
        //else sum += p2[i];
    */
    blockFE = index[ch2];
}